

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

SinhLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_sinh(NeuralNetworkLayer *this)

{
  bool bVar1;
  SinhLayerParams *this_00;
  NeuralNetworkLayer *this_local;
  
  bVar1 = has_sinh(this);
  if (!bVar1) {
    clear_layer(this);
    set_has_sinh(this);
    this_00 = (SinhLayerParams *)operator_new(0x18);
    SinhLayerParams::SinhLayerParams(this_00);
    (this->layer_).sinh_ = this_00;
  }
  return (SinhLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::SinhLayerParams* NeuralNetworkLayer::mutable_sinh() {
  if (!has_sinh()) {
    clear_layer();
    set_has_sinh();
    layer_.sinh_ = new ::CoreML::Specification::SinhLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.sinh)
  return layer_.sinh_;
}